

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluInitTruthTables(void)

{
  word *pwVar1;
  uint *puVar2;
  undefined4 uVar3;
  word wVar4;
  word (*pawVar5) [1024];
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  pawVar5 = TruthAll;
  lVar6 = 0;
  do {
    wVar4 = Truth6[lVar6];
    uVar3 = *(undefined4 *)((long)Truth6 + lVar6 * 8 + 4);
    lVar9 = 0;
    do {
      pwVar1 = *pawVar5 + lVar9;
      *(int *)pwVar1 = (int)wVar4;
      *(undefined4 *)((long)pwVar1 + 4) = uVar3;
      *(int *)(pwVar1 + 1) = (int)wVar4;
      *(undefined4 *)((long)pwVar1 + 0xc) = uVar3;
      lVar9 = lVar9 + 2;
    } while (lVar9 != 0x400);
    lVar6 = lVar6 + 1;
    pawVar5 = pawVar5 + 1;
  } while (lVar6 != 6);
  lVar6 = 6;
  lVar9 = 0xd17e50;
  do {
    uVar8 = 1 << ((char)lVar6 - 6U & 0x1f);
    lVar7 = 0;
    uVar10 = 0;
    uVar11 = 1;
    do {
      uVar12 = uVar8 & uVar10;
      uVar13 = uVar8 & uVar11;
      puVar2 = (uint *)(lVar9 + lVar7 * 8);
      *puVar2 = -(uint)(uVar12 == 0) ^ 0xffffffff;
      puVar2[1] = -(uint)(uVar12 == 0) ^ 0xffffffff;
      puVar2[2] = -(uint)(uVar13 == 0) ^ 0xffffffff;
      puVar2[3] = -(uint)(uVar13 == 0) ^ 0xffffffff;
      lVar7 = lVar7 + 2;
      uVar10 = uVar10 + 2;
      uVar11 = uVar11 + 2;
    } while (lVar7 != 0x400);
    lVar6 = lVar6 + 1;
    lVar9 = lVar9 + 0x2000;
  } while (lVar6 != 0x10);
  return;
}

Assistant:

void If_CluInitTruthTables()
{
    int i, k;
    assert( CLU_VAR_MAX <= 16 );
    for ( i = 0; i < 6; i++ )
        for ( k = 0; k < CLU_WRD_MAX; k++ )
            TruthAll[i][k] = Truth6[i];
    for ( i = 6; i < CLU_VAR_MAX; i++ )
        for ( k = 0; k < CLU_WRD_MAX; k++ )
            TruthAll[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;

//    Extra_PrintHex( stdout, TruthAll[6], 8 ); printf( "\n" );
//    Extra_PrintHex( stdout, TruthAll[7], 8 ); printf( "\n" );
}